

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repair_Response_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Repair_Response_PDU::Encode(Repair_Response_PDU *this,KDataStream *stream)

{
  Logistics_Header::Encode(&this->super_Logistics_Header,stream);
  KDataStream::Write(stream,this->m_ui8RepairResult);
  KDataStream::Write(stream,this->m_ui8Padding);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  return;
}

Assistant:

void Repair_Response_PDU::Encode( KDataStream & stream ) const
{
    Logistics_Header::Encode( stream );
    stream << m_ui8RepairResult
           << m_ui8Padding
           << m_ui16Padding;
}